

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextEngineTests.cpp
# Opt level: O2

void __thiscall
agge::tests::TextEngineTests::GarbageFontIsReusedForTheSameRequest(TextEngineTests *this)

{
  vector<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
  *this_00;
  path_point (*in_RDX) [3];
  long lVar1;
  allocator local_411;
  font_descriptor local_410;
  LocationInfo local_3e8;
  undefined1 local_3c0 [16];
  void *pvf1;
  char_to_index indices [1];
  ptr f2;
  ptr f1;
  void *pvf2;
  glyph glyphs [1];
  logging_text_engine e;
  fonts_loader loader;
  pair<agge::font_descriptor,_agge::tests::mocks::font_accessor> fonts [2];
  
  indices[0].symbol = 0x61;
  indices[0].index = 0;
  mocks::glyph<agge::glyph::path_point_const,3ul>(glyphs,(mocks *)c_outline_1,5.2,0.0,in_RDX);
  std::__cxx11::string::string((string *)&f1,"Arial",(allocator *)local_3c0);
  font_descriptor::create((font_descriptor *)&local_3e8,(string *)&f1,10,regular,false,hint_strong);
  mocks::font_accessor::font_accessor<1ul,1ul>
            ((font_accessor *)&e,(font_metrics *)&(anonymous_namespace)::c_fm2,&indices,&glyphs);
  std::pair<agge::font_descriptor,_agge::tests::mocks::font_accessor>::
  pair<agge::font_descriptor,_agge::tests::mocks::font_accessor,_true>
            (fonts,(font_descriptor *)&local_3e8,(font_accessor *)&e);
  std::__cxx11::string::string((string *)&f2,"Tahoma",(allocator *)&pvf1);
  font_descriptor::create(&local_410,(string *)&f2,10,bold,false,hint_strong);
  mocks::font_accessor::font_accessor<1ul,1ul>
            ((font_accessor *)&loader,(font_metrics *)&(anonymous_namespace)::c_fm2,&indices,&glyphs
            );
  std::pair<agge::font_descriptor,_agge::tests::mocks::font_accessor>::
  pair<agge::font_descriptor,_agge::tests::mocks::font_accessor,_true>
            (fonts + 1,&local_410,(font_accessor *)&loader);
  mocks::font_accessor::~font_accessor((font_accessor *)&loader);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&f2);
  mocks::font_accessor::~font_accessor((font_accessor *)&e);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&f1);
  mocks::fonts_loader::
  fonts_loader<std::pair<agge::font_descriptor,agge::tests::mocks::font_accessor>,2ul>
            (&loader,&fonts);
  mocks::logging_text_engine::logging_text_engine(&e,&loader.super_loader,1);
  std::__cxx11::string::string((string *)&local_410,"Arial",(allocator *)&f2);
  font_descriptor::create
            ((font_descriptor *)&local_3e8,&local_410.family,10,regular,false,hint_strong);
  text_engine_base::create_font((text_engine_base *)&f1,(font_descriptor *)&e);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string((string *)&local_410,"Tahoma",(allocator *)local_3c0);
  font_descriptor::create((font_descriptor *)&local_3e8,&local_410.family,10,bold,false,hint_strong)
  ;
  text_engine_base::create_font((text_engine_base *)&f2,(font_descriptor *)&e);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_410);
  pvf1 = f1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pvf2 = f2.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = &loader.created_log;
  std::
  vector<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
  ::clear(this_00);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::reset
            (&f1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::reset
            (&f2.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&local_410,"Tahoma",&local_411);
  font_descriptor::create((font_descriptor *)&local_3e8,&local_410.family,10,bold,false,hint_strong)
  ;
  text_engine_base::create_font((text_engine_base *)local_3c0,(font_descriptor *)&e);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&f2.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> *)local_3c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3c0 + 8));
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_410);
  local_3c0._0_8_ = f2.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string
            ((string *)&local_410,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/TextEngineTests.cpp"
             ,&local_411);
  ut::LocationInfo::LocationInfo(&local_3e8,&local_410.family,0x3a5);
  ut::are_equal<void*,agge::font*>(&pvf2,(font **)local_3c0,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string
            ((string *)&local_410,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/TextEngineTests.cpp"
             ,(allocator *)local_3c0);
  ut::LocationInfo::LocationInfo(&local_3e8,&local_410.family,0x3a6);
  ut::
  is_empty<std::vector<std::pair<agge::font_descriptor,std::weak_ptr<agge::font::accessor>>,std::allocator<std::pair<agge::font_descriptor,std::weak_ptr<agge::font::accessor>>>>>
            (this_00,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string((string *)&local_410,"Arial",&local_411);
  font_descriptor::create
            ((font_descriptor *)&local_3e8,&local_410.family,10,regular,false,hint_strong);
  text_engine_base::create_font((text_engine_base *)local_3c0,(font_descriptor *)&e);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&f1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> *)local_3c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3c0 + 8));
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_410);
  local_3c0._0_8_ = f1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string
            ((string *)&local_410,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/TextEngineTests.cpp"
             ,&local_411);
  ut::LocationInfo::LocationInfo(&local_3e8,&local_410.family,0x3ac);
  ut::are_equal<void*,agge::font*>(&pvf1,(font **)local_3c0,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string
            ((string *)&local_410,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/TextEngineTests.cpp"
             ,(allocator *)local_3c0);
  ut::LocationInfo::LocationInfo(&local_3e8,&local_410.family,0x3ad);
  ut::
  is_empty<std::vector<std::pair<agge::font_descriptor,std::weak_ptr<agge::font::accessor>>,std::allocator<std::pair<agge::font_descriptor,std::weak_ptr<agge::font::accessor>>>>>
            (this_00,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_410);
  text_engine_base::collect(&e.super_text_engine_base);
  local_3c0._0_4_ = 2;
  std::__cxx11::string::string
            ((string *)&local_410,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/TextEngineTests.cpp"
             ,&local_411);
  ut::LocationInfo::LocationInfo(&local_3e8,&local_410.family,0x3b3);
  ut::are_equal<unsigned_int,unsigned_long>
            ((uint *)local_3c0,
             loader.allocated.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_410);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f2.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  mocks::logging_text_engine::~logging_text_engine(&e);
  mocks::fonts_loader::~fonts_loader(&loader);
  lVar1 = 0xd8;
  do {
    std::pair<agge::font_descriptor,_agge::tests::mocks::font_accessor>::~pair
              ((pair<agge::font_descriptor,_agge::tests::mocks::font_accessor> *)
               ((long)&fonts[0].first.family._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0xd8;
  } while (lVar1 != -0xd8);
  std::_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::
  ~_Vector_base(&glyphs[0].outline.
                 super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
               );
  return;
}

Assistant:

test( GarbageFontIsReusedForTheSameRequest )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L'a', 0 }, };
				mocks::font_accessor::glyph glyphs[] = { mocks::glyph(5.2, 0, c_outline_1), };
				pair<font_descriptor, mocks::font_accessor> fonts[] = {
					make_pair(font_descriptor::create("Arial", 10, regular, false, hint_strong),
						mocks::font_accessor(c_fm2, indices, glyphs)),
					make_pair(font_descriptor::create("Tahoma", 10, bold, false, hint_strong),
						mocks::font_accessor(c_fm2, indices, glyphs)),
				};
				mocks::fonts_loader loader(fonts);
				mocks::logging_text_engine e(loader, 1);
				font::ptr f1 = e.create_font(font_descriptor::create("Arial", 10, regular, false, hint_strong));
				font::ptr f2 = e.create_font(font_descriptor::create("Tahoma", 10, bold, false, hint_strong));
				void *pvf1 = f1.get();
				void *pvf2 = f2.get();

				loader.created_log.clear();
				f1.reset();
				f2.reset();

				// ACT
				f2 = e.create_font(font_descriptor::create("Tahoma", 10, bold, false, hint_strong));

				// ASSERT
				assert_equal(pvf2, f2.get());
				assert_is_empty(loader.created_log);

				// ACT
				f1 = e.create_font(font_descriptor::create("Arial", 10, regular, false, hint_strong));

				// ASSERT
				assert_equal(pvf1, f1.get());
				assert_is_empty(loader.created_log);

				// ACT
				e.collect();

				// ASSERT
				assert_equal(2u, *loader.allocated);
			}